

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

void __thiscall
cuckoocache_tests::EraseParallelTest::
test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (EraseParallelTest *this,size_t megabytes)

{
  uchar *puVar1;
  long lVar2;
  double dVar3;
  uint256 e;
  uint256 e_00;
  pointer ptVar4;
  pointer puVar5;
  bool bVar6;
  uint64_t uVar7;
  thread *t;
  pointer ptVar8;
  uint32_t x;
  int iVar9;
  iterator in_R8;
  iterator pvVar10;
  iterator in_R9;
  double *pdVar11;
  ulong uVar12;
  long lVar13;
  uint32_t i_1;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint32_t i;
  ulong uVar18;
  long lVar19;
  long in_FS_OFFSET;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  assertion_result *paVar24;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  assertion_result local_218;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  double hit_rate_fresh;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  uint32_t n_insert;
  vector<uint256,_std::allocator<uint256>_> hashes;
  unique_lock<std::shared_mutex> l;
  unique_lock<std::shared_mutex> l_1;
  shared_mutex mtx;
  cache<uint256,_SignatureCacheHasher> set;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&set);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes(&set,megabytes << 0x14);
  uVar16 = (megabytes << 0x14) >> 5;
  uVar15 = (uint)uVar16;
  std::vector<uint256,_std::allocator<uint256>_>::resize(&hashes,uVar16 & 0xffffffff);
  lVar17 = 0;
  for (uVar18 = 0;
      puVar5 = hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start, uVar18 < (uVar16 & 0xffffffff); uVar18 = uVar18 + 1
      ) {
    for (lVar14 = 0; (char)lVar14 != '\b'; lVar14 = lVar14 + 1) {
      uVar7 = RandomMixin<FastRandomContext>::randbits<32>
                        (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>
                        );
      *(int *)((puVar5->super_base_blob<256U>).m_data._M_elems + lVar14 * 4 + lVar17) = (int)uVar7;
    }
    lVar17 = lVar17 + 0x20;
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector(&hashes_insert_copy,&hashes);
  mtx._M_impl._M_rwlock._32_8_ = 0;
  mtx._M_impl._M_rwlock.__data.__pad2 = 0;
  mtx._M_impl._M_rwlock._16_8_ = 0;
  mtx._M_impl._M_rwlock._24_8_ = 0;
  mtx._M_impl._M_rwlock.__align = 0;
  mtx._M_impl._M_rwlock._8_8_ = 0;
  mtx._M_impl._M_rwlock._48_8_ = 0;
  std::unique_lock<std::shared_mutex>::unique_lock(&l_1,&mtx);
  lVar17 = 0;
  for (uVar18 = 0; uVar18 < uVar15 >> 1; uVar18 = uVar18 + 1) {
    puVar1 = ((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             lVar17 + 0x10;
    e.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
    e.super_base_blob<256U>.m_data._M_elems._0_16_ =
         *(undefined1 (*) [16])
          (((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17);
    e.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&set,e);
    lVar17 = lVar17 + 0x20;
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&l_1);
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (iVar9 = 0;
      ptVar4 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish,
      ptVar8 = threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start, iVar9 != 3; iVar9 = iVar9 + 1) {
    l_1._M_device = (mutex_type *)CONCAT44(l_1._M_device._4_4_,iVar9);
    l_1._8_8_ = &mtx;
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<cuckoocache_tests::EraseParallelTest::test_cache_erase_parallel<CuckooCache::cache<uint256,SignatureCacheHasher>>(unsigned_long)::_lambda()_1_>
              ((vector<std::thread,std::allocator<std::thread>> *)&threads,
               (anon_class_40_5_413ab67b_for__M_head_impl *)&l_1);
  }
  for (; ptVar8 != ptVar4; ptVar8 = ptVar8 + 1) {
    std::thread::join();
  }
  std::unique_lock<std::shared_mutex>::unique_lock(&l,&mtx);
  uVar18 = (ulong)(uVar15 >> 1);
  lVar17 = uVar18 << 5;
  for (; uVar18 < (uVar16 & 0xffffffff); uVar18 = uVar18 + 1) {
    puVar1 = ((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
             lVar17 + 0x10;
    e_00.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)puVar1;
    e_00.super_base_blob<256U>.m_data._M_elems._0_16_ =
         *(undefined1 (*) [16])
          (((hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
             super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems + lVar17);
    e_00.super_base_blob<256U>.m_data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 8);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert(&set,e_00);
    lVar17 = lVar17 + 0x20;
  }
  lVar14 = 0;
  lVar17 = 0;
  for (uVar18 = 0; uVar12 = (ulong)(uVar15 >> 2), uVar18 < uVar12; uVar18 = uVar18 + 1) {
    bVar6 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + lVar14),false);
    lVar17 = lVar17 + (ulong)bVar6;
    lVar14 = lVar14 + 0x20;
  }
  lVar14 = uVar12 << 5;
  lVar19 = 0;
  for (; uVar18 = (ulong)(uVar15 >> 1), uVar12 < uVar18; uVar12 = uVar12 + 1) {
    bVar6 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + lVar14),false);
    lVar19 = lVar19 + (ulong)bVar6;
    lVar14 = lVar14 + 0x20;
  }
  lVar14 = uVar18 << 5;
  lVar13 = 0;
  for (; uVar18 < (uVar16 & 0xffffffff); uVar18 = uVar18 + 1) {
    bVar6 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains
                      (&set,(uint256 *)
                            (((hashes.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                               super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data.
                             _M_elems + lVar14),false);
    lVar13 = lVar13 + (ulong)bVar6;
    lVar14 = lVar14 + 0x20;
  }
  dVar23 = (double)(uVar16 & 0xffffffff);
  auVar20._8_4_ = (int)((ulong)lVar13 >> 0x20);
  auVar20._0_8_ = lVar13;
  auVar20._12_4_ = 0x45300000;
  hit_rate_fresh =
       ((auVar20._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar13) - 4503599627370496.0)) / (dVar23 * 0.5);
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x10f;
  file.m_begin = (iterator)&local_1c0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1d0,msg);
  l_1._8_8_ = l_1._8_8_ & 0xffffffffffffff00;
  l_1._M_device = (mutex_type *)&PTR__lazy_ostream_01139f30;
  local_1e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1d8 = "";
  paVar24 = &local_218;
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_218._1_7_ = 0x3ff00000000000;
  pvVar10 = (iterator)0x2;
  pdVar11 = &hit_rate_fresh;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,double,double>
            (&l_1,&local_1e0,0x10f,1,2,pdVar11,0xb7aff1,paVar24,"1.0");
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pdVar11;
  msg_00.m_begin = pvVar10;
  file_00.m_end = (iterator)0x112;
  file_00.m_begin = (iterator)&local_1f0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_200,
             msg_00);
  auVar21._8_4_ = (int)((ulong)lVar17 >> 0x20);
  auVar21._0_8_ = lVar17;
  auVar21._12_4_ = 0x45300000;
  dVar23 = dVar23 * 0.25;
  dVar3 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) / dVar23;
  auVar22._8_4_ = (int)((ulong)lVar19 >> 0x20);
  auVar22._0_8_ = lVar19;
  auVar22._12_4_ = 0x45300000;
  local_218.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       (readonly_property<bool>)
       (dVar3 + dVar3 <
       ((auVar22._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar19) - 4503599627370496.0)) / dVar23);
  local_218.m_message.px = (element_type *)0x0;
  local_218.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_228 = "hit_rate_stale > 2 * hit_rate_erased_but_contained";
  local_220 = "";
  l_1._8_8_ = l_1._8_8_ & 0xffffffffffffff00;
  l_1._M_device = (mutex_type *)&PTR__lazy_ostream_0113a070;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/cuckoocache_tests.cpp"
  ;
  local_230 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_218,(lazy_ostream *)&l_1,1,0,WARN,(check_type)paVar24,(size_t)&local_238,0x112);
  boost::detail::shared_count::~shared_count(&local_218.m_message.pn);
  std::unique_lock<std::shared_mutex>::~unique_lock(&l);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashes_insert_copy.super__Vector_base<uint256,_std::allocator<uint256>_>);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&set);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
            (&hashes.super__Vector_base<uint256,_std::allocator<uint256>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void test_cache_erase_parallel(size_t megabytes)
{
    double load = 1;
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    std::shared_mutex mtx;

    {
        /** Grab lock to make sure we release inserts */
        std::unique_lock<std::shared_mutex> l(mtx);
        /** Insert the first half */
        for (uint32_t i = 0; i < (n_insert / 2); ++i)
            set.insert(hashes_insert_copy[i]);
    }

    /** Spin up 3 threads to run contains with erase.
     */
    std::vector<std::thread> threads;
    /** Erase the first quarter */
    for (uint32_t x = 0; x < 3; ++x)
        /** Each thread is emplaced with x copy-by-value
        */
        threads.emplace_back([&, x] {
            std::shared_lock<std::shared_mutex> l(mtx);
            size_t ntodo = (n_insert/4)/3;
            size_t start = ntodo*x;
            size_t end = ntodo*(x+1);
            for (uint32_t i = start; i < end; ++i) {
                bool contains = set.contains(hashes[i], true);
                assert(contains);
            }
        });

    /** Wait for all threads to finish
     */
    for (std::thread& t : threads)
        t.join();
    /** Grab lock to make sure we observe erases */
    std::unique_lock<std::shared_mutex> l(mtx);
    /** Insert the second half */
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        set.insert(hashes_insert_copy[i]);

    /** elements that we marked erased but that are still there */
    size_t count_erased_but_contained = 0;
    /** elements that we did not erase but are older */
    size_t count_stale = 0;
    /** elements that were most recently inserted */
    size_t count_fresh = 0;

    for (uint32_t i = 0; i < (n_insert / 4); ++i)
        count_erased_but_contained += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 4); i < (n_insert / 2); ++i)
        count_stale += set.contains(hashes[i], false);
    for (uint32_t i = (n_insert / 2); i < n_insert; ++i)
        count_fresh += set.contains(hashes[i], false);

    double hit_rate_erased_but_contained = double(count_erased_but_contained) / (double(n_insert) / 4.0);
    double hit_rate_stale = double(count_stale) / (double(n_insert) / 4.0);
    double hit_rate_fresh = double(count_fresh) / (double(n_insert) / 2.0);

    // Check that our hit_rate_fresh is perfect
    BOOST_CHECK_EQUAL(hit_rate_fresh, 1.0);
    // Check that we have a more than 2x better hit rate on stale elements than
    // erased elements.
    BOOST_CHECK(hit_rate_stale > 2 * hit_rate_erased_but_contained);
}